

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::substring::insertionsort<char*,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator first,iterator last,value_type depth)

{
  pos_type pVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar5;
  pos_type pVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  iterator p2;
  iterator p2_00;
  iterator p1;
  iterator p1_00;
  
  pVar6 = PA.pos_;
  p1.array_ = PA.array_;
  uVar5 = last.pos_;
  uVar2 = last.pos_;
  do {
    uVar2 = uVar2 - 1;
    if (uVar2 <= first.pos_) {
      return;
    }
    iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar5 - 2);
    pVar1 = CONCAT44(extraout_var,iVar3) + pVar6;
    iVar4 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar2);
    p2.pos_ = CONCAT44(extraout_var_00,iVar4) + pVar6;
    p2.array_ = p1.array_;
    p1.pos_ = pVar1;
    iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
    uVar7 = uVar5;
    uVar8 = uVar2;
    if (iVar4 < 1) {
LAB_0010859d:
      bVar9 = iVar4 == 0;
      uVar7 = uVar8;
    }
    else {
      while( true ) {
        iVar4 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar7 - 1);
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last.array_,uVar7 - 2,CONCAT44(extraout_var_01,iVar4));
        if (last.pos_ <= uVar7) break;
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar7);
        if (-1 < extraout_var_02) {
          iVar4 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar7);
          p2_00.pos_ = CONCAT44(extraout_var_03,iVar4) + pVar6;
          p2_00.array_ = p1.array_;
          p1_00.pos_ = pVar1;
          p1_00.array_ = p1.array_;
          iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_00,p2_00,depth);
          uVar8 = uVar7;
          if (iVar4 < 1) goto LAB_0010859d;
        }
        uVar7 = uVar7 + 1;
      }
      bVar9 = false;
    }
    if (bVar9) {
      iVar4 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar7);
      (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                (last.array_,uVar7,~CONCAT44(extraout_var_04,iVar4));
    }
    (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
              (last.array_,uVar7 - 1,CONCAT44(extraout_var,iVar3));
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

void insertionsort(
    StringIterator_type T, const SAIterator_type PA, SAIterator_type first,
    SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type a, b;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r;

  for (a = last - 1; first < a; --a) {
    for (t = *(a - 1), b = a; 0 < (r = compare(T, PA + t, PA + *b, depth));) {
      do {
        *(b - 1) = *b;
      } while ((++b < last) && (*b < 0));
      if (last <= b) {
        break;
      }
    }
    if (r == 0) {
      *b = ~*b;
    }
    *(b - 1) = t;
  }
}